

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_agencies_db(feed_db_t *db,agency_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  agency_t *paVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  agency_t record;
  char qr [129];
  sqlite3_stmt *local_340;
  agency_t local_338;
  char local_b8 [136];
  
  uVar2 = count_rows_db(db,"agency");
  if (0 < (int)uVar2) {
    memcpy(local_b8,
           "SELECT agency_id, agency_name,agency_url, agency_timezone,agency_lang, agency_phone,agency_fare_url, agency_email FROM `agency`;"
           ,0x81);
    sqlite3_prepare_v2(db->conn,local_b8,-1,&local_340,(char **)0x0);
    paVar4 = (agency_t *)malloc((ulong)uVar2 * 0x280);
    *records = paVar4;
    uVar1 = 0xffffffff;
    if (paVar4 != (agency_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_340);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_agency(&local_338);
        puVar5 = sqlite3_column_text(local_340,0);
        strcpy(local_338.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,1);
        strcpy(local_338.name,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,2);
        strcpy(local_338.url,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,3);
        strcpy(local_338.timezone,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,4);
        strcpy(local_338.lang,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,5);
        strcpy(local_338.phone,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,6);
        strcpy(local_338.fare_url,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_340,7);
        strcpy(local_338.email,(char *)puVar5);
        memcpy((*records)->id + lVar6,&local_338,0x280);
        lVar6 = lVar6 + 0x280;
      } while ((ulong)uVar2 * 0x280 != lVar6);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_340);
  }
  return uVar2;
}

Assistant:

int fetch_all_agencies_db(feed_db_t *db, agency_t **records) {

    agency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "agency");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "agency_id, agency_name,"
                    "agency_url, agency_timezone,"
                    "agency_lang, agency_phone,"
                    "agency_fare_url, agency_email "
                "FROM `agency`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_agency(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.name, sqlite3_column_text(stmt, 1));
        strcpy(record.url, sqlite3_column_text(stmt, 2));
        strcpy(record.timezone, sqlite3_column_text(stmt, 3));
        strcpy(record.lang, sqlite3_column_text(stmt, 4));
        strcpy(record.phone, sqlite3_column_text(stmt, 5));
        strcpy(record.fare_url, sqlite3_column_text(stmt, 6));
        strcpy(record.email, sqlite3_column_text(stmt, 7));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}